

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::CallIExtended
          (ByteCodeWriter *this,OpCode op,RegSlot returnValueRegister,RegSlot functionRegister,
          ArgSlot givenArgCount,CallIExtendedOptions options,void *buffer,uint byteCount,
          ProfileId callSiteId,CallFlags callFlags)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot reg;
  bool bVar4;
  bool bVar5;
  RegSlot returnValueRegister_00;
  undefined4 *puVar6;
  uint byteSize;
  undefined7 in_register_00000089;
  CacheIdUnit CVar7;
  uint32 spreadArgsOffset;
  CallIExtendedOptions options_00;
  ulong uVar8;
  ArgSlot local_73;
  RegSlot local_71;
  RegSlot local_6d;
  undefined1 local_69;
  uint32 local_68;
  CallFlags local_64;
  CacheIdUnit local_60;
  CacheIdUnit unit;
  Type local_40;
  Type local_3e;
  uint local_3c;
  ProfileId profileId;
  ProfileId profileId2;
  OpCode local_32;
  RegSlot functionRegister_local;
  OpCode op_local;
  
  uVar8 = CONCAT71(in_register_00000089,options) & 0xffffffff;
  _profileId = functionRegister;
  local_32 = op;
  CheckOpen(this);
  CheckOp(this,local_32,(OpLayoutType)((uint)(callFlags != CallFlags_None) * 3 + 0x26));
  bVar4 = OpCodeAttr::HasMultiSizeLayout(local_32);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x42a,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar4) goto LAB_0089df25;
    *puVar6 = 0;
  }
  if (returnValueRegister == 0xffffffff) {
    returnValueRegister_00 = 0xffffffff;
  }
  else {
    if (this->m_functionWrite == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar4) goto LAB_0089df25;
      *puVar6 = 0;
    }
    returnValueRegister_00 = FunctionBody::MapRegSlot(this->m_functionWrite,returnValueRegister);
  }
  reg = _profileId;
  if (_profileId == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
    if (bVar4) {
      *puVar6 = 0;
      Throw::InternalError();
    }
    goto LAB_0089df25;
  }
  local_3c = (uint)CONCAT71(in_register_00000089,options);
  if (this->m_functionWrite == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
    if (!bVar4) goto LAB_0089df25;
    *puVar6 = 0;
    uVar8 = (ulong)local_3c;
  }
  options_00 = (CallIExtendedOptions)uVar8;
  _profileId = FunctionBody::MapRegSlot(this->m_functionWrite,reg);
  local_60.cacheId = 0xffffffff;
  JsUtil::
  BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::TryGetValueAndRemove(this->callRegToLdFldCacheIndexMap,(uint *)&profileId,&local_60);
  local_40 = callSiteId;
  local_3e = 0xffff;
  if ((ushort)(local_32 - CallI) < 4) {
    bVar4 = DoDynamicProfileOpcode(this,InlinePhase,false);
    if ((callSiteId == 0xffff) || (!bVar4)) {
      bVar4 = DynamicProfileInfo::IsEnabled(AggressiveIntTypeSpecPhase,this->m_functionWrite);
      if ((bVar4) ||
         (bVar4 = DynamicProfileInfo::IsEnabled(FloatTypeSpecPhase,this->m_functionWrite), bVar4)) {
        TVar1 = this->m_functionWrite->profiledReturnTypeCount;
        if (TVar1 != 0xffff) {
          this->m_functionWrite->profiledReturnTypeCount = TVar1 + 1;
          local_40 = TVar1;
          local_32 = OpCodeUtil::ConvertCallOpToProfiledReturnType(local_32);
          goto LAB_0089dc85;
        }
      }
LAB_0089dc45:
      bVar4 = false;
      bVar3 = false;
    }
    else {
      bVar4 = false;
      local_32 = OpCodeUtil::ConvertCallOpToProfiled(local_32,false);
LAB_0089dc10:
      bVar3 = true;
    }
  }
  else {
    bVar4 = DoProfileNewScObjArrayOp(this,local_32);
    if (bVar4) {
      bVar4 = DynamicProfileInfo::IsEnabled(NativeArrayPhase,this->m_functionWrite);
      if (bVar4) {
        if (callSiteId != 0xffff) {
LAB_0089dbe5:
          TVar1 = this->m_functionWrite->profiledArrayCallSiteCount;
          if (TVar1 != 0xffff) {
            this->m_functionWrite->profiledArrayCallSiteCount = TVar1 + 1;
            local_3e = TVar1;
            OpCodeUtil::ConvertNonCallOpToProfiled(&local_32);
            bVar4 = true;
            goto LAB_0089dc10;
          }
        }
      }
      else {
        bVar4 = DoDynamicProfileOpcode(this,InlinePhase,true);
        if ((callSiteId != 0xffff) && (bVar4)) goto LAB_0089dbe5;
      }
    }
    bVar4 = DoProfileNewScObjectOp(this,local_32);
    if (bVar4) {
      bVar4 = DoDynamicProfileOpcode(this,InlinePhase,true);
      if (bVar4) {
        if (callSiteId == 0xffff) goto LAB_0089dc45;
      }
      else {
        bVar5 = DynamicProfileInfo::IsEnabled(FixedNewObjPhase,this->m_functionWrite);
        bVar4 = false;
        if (callSiteId == 0xffff) goto LAB_0089dc4f;
        bVar3 = false;
        if (!bVar5) goto LAB_0089dc8a;
      }
      OpCodeUtil::ConvertNonCallOpToProfiled(&local_32);
LAB_0089dc85:
      bVar3 = true;
      bVar4 = false;
    }
    else {
LAB_0089dc4f:
      bVar4 = false;
      bVar3 = false;
    }
  }
LAB_0089dc8a:
  CVar7.cacheId = 0;
  CVar7.isRootObjectCache = false;
  CVar7._5_3_ = 0;
  if ((uVar8 & 1) != 0) {
    if (buffer == (void *)0x0 || byteCount == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x460,"(buffer != nullptr && byteCount > 0)",
                                  "buffer != nullptr && byteCount > 0");
      if (!bVar5) {
LAB_0089df25:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    CVar7._4_4_ = 0;
    CVar7.cacheId = (this->m_auxiliaryData).currentOffset;
    if (byteCount != 0) {
      Data::Encode(&this->m_auxiliaryData,buffer,byteCount);
    }
    options_00 = (CallIExtendedOptions)local_3c;
  }
  spreadArgsOffset = CVar7.cacheId;
  if (callFlags == CallFlags_None) {
    bVar5 = TryWriteCallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,local_32,returnValueRegister_00,_profileId,givenArgCount,options_00,
                       spreadArgsOffset);
    if ((bVar5) ||
       (bVar5 = TryWriteCallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                          (this,local_32,returnValueRegister_00,_profileId,givenArgCount,options_00,
                           spreadArgsOffset), bVar5)) goto LAB_0089de8f;
    local_6d = _profileId;
    local_69 = (undefined1)local_3c;
    local_73 = givenArgCount;
    local_71 = returnValueRegister_00;
    local_68 = spreadArgsOffset;
    Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,local_32,this);
    byteSize = 0xf;
  }
  else {
    unit = CVar7;
    bVar5 = TryWriteCallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,local_32,returnValueRegister_00,_profileId,givenArgCount,options_00,
                       spreadArgsOffset,callFlags);
    if ((bVar5) ||
       (bVar5 = TryWriteCallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                          (this,local_32,returnValueRegister_00,_profileId,givenArgCount,options_00,
                           unit.cacheId,callFlags), bVar5)) goto LAB_0089de8f;
    local_6d = _profileId;
    local_69 = (undefined1)local_3c;
    local_68 = unit.cacheId;
    local_64 = callFlags;
    local_73 = givenArgCount;
    local_71 = returnValueRegister_00;
    Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,local_32,this);
    byteSize = 0x13;
  }
  Data::Write(&this->m_byteCodeData,&local_73,byteSize);
LAB_0089de8f:
  if (bVar3) {
    Data::Write(&this->m_byteCodeData,&local_40,2);
    if (bVar4) {
      Data::Write(&this->m_byteCodeData,&local_3e,2);
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::CallIExtended(OpCode op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, CallIExtendedOptions options, const void *buffer, uint byteCount, ProfileId callSiteId, CallFlags callFlags)
    {
        CheckOpen();
        bool hasCallFlags = !(callFlags == CallFlags_None);
        if (hasCallFlags)
        {
            CheckOp(op, OpLayoutType::CallIExtendedFlags);
        }
        else
        {
            CheckOp(op, OpLayoutType::CallIExtended);
        }
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        // givenArgCount could be <, ==, or > than Function's "InParams" count

        if (returnValueRegister != Js::Constants::NoRegister)
        {
            returnValueRegister = ConsumeReg(returnValueRegister);
        }
        functionRegister = ConsumeReg(functionRegister);

        // CallISpread is not going to use the ldFld cache index, but still remove it from the map as we expect
        // the entry for a cache index to be removed once we have seen the corresponding call.
        CacheIdUnit unit;
        unit.cacheId = Js::Constants::NoInlineCacheIndex;
        callRegToLdFldCacheIndexMap->TryGetValueAndRemove(functionRegister, &unit);

        bool isProfiled = false, isProfiled2 = false;
        ProfileId profileId = callSiteId, profileId2 = Constants::NoProfileId;
        bool isCallWithICIndex = false;

        if (DoProfileCallOp(op))
        {
            if (DoDynamicProfileOpcode(InlinePhase) &&
                callSiteId != Js::Constants::NoProfileId)
            {
                op = Js::OpCodeUtil::ConvertCallOpToProfiled(op);
                isProfiled = true;
            }
            else if ((DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) || DoDynamicProfileOpcode(FloatTypeSpecPhase)) &&
                this->m_functionWrite->AllocProfiledReturnTypeId(&profileId))
            {
                op = Js::OpCodeUtil::ConvertCallOpToProfiledReturnType(op);
                isProfiled = true;
            }
        }
        else if (DoProfileNewScObjArrayOp(op) &&
            (DoDynamicProfileOpcode(NativeArrayPhase, true) || DoDynamicProfileOpcode(InlinePhase, true)) &&
            callSiteId != Js::Constants::NoProfileId &&
            this->m_functionWrite->AllocProfiledArrayCallSiteId(&profileId2))
        {
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
            isProfiled = true;
            isProfiled2 = true;
        }
        else if (DoProfileNewScObjectOp(op) && (DoDynamicProfileOpcode(InlinePhase, true) || DoDynamicProfileOpcode(FixedNewObjPhase, true)) &&
            callSiteId != Js::Constants::NoProfileId)
        {
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
            isProfiled = true;
        }

        uint spreadArgsOffset = 0;
        if (options & CallIExtended_SpreadArgs)
        {
            Assert(buffer != nullptr && byteCount > 0);
            spreadArgsOffset = InsertAuxiliaryData(buffer, byteCount);
        }

        if (isCallWithICIndex)
        {
            if (hasCallFlags == true)
            {
                MULTISIZE_LAYOUT_WRITE(CallIExtendedFlagsWithICIndex, op, returnValueRegister, functionRegister, givenArgCount, unit.cacheId, unit.isRootObjectCache, options, spreadArgsOffset, callFlags);
            }
            else
            {
                MULTISIZE_LAYOUT_WRITE(CallIExtendedWithICIndex, op, returnValueRegister, functionRegister, givenArgCount, unit.cacheId, unit.isRootObjectCache, options, spreadArgsOffset);
            }
        }
        else
        {
            if (hasCallFlags == true)
            {
                MULTISIZE_LAYOUT_WRITE(CallIExtendedFlags, op, returnValueRegister, functionRegister, givenArgCount, options, spreadArgsOffset, callFlags);
            }
            else
            {
                MULTISIZE_LAYOUT_WRITE(CallIExtended, op, returnValueRegister, functionRegister, givenArgCount, options, spreadArgsOffset);
            }
        }

        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
            if (isProfiled2)
            {
                m_byteCodeData.Encode(&profileId2, sizeof(Js::ProfileId));
            }
        }
    }